

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_chk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  ushort uVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  uintptr_t o;
  int opsize;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = insn >> 7 & 3;
  if (uVar1 == 3) {
    opsize = 1;
  }
  else {
    if ((uVar1 != 2) || ((env->features & 0x2000000) == 0)) {
      gen_exception(s,(s->base).pc_next,4);
      return;
    }
    opsize = 2;
  }
  pTVar2 = gen_ea(env,s,insn,opsize,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar2 != tcg_ctx->NULL_QREG) {
    pTVar3 = gen_extend(s,*(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38)),opsize
                        ,1);
    gen_flush_flags(s);
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = pTVar3 + (long)tcg_ctx;
    local_38 = pTVar2 + (long)tcg_ctx;
    tcg_gen_callN_m68k(tcg_ctx,helper_chk_m68k,(TCGTemp *)0x0,3,&local_48);
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(chk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, reg;
    int opsize;

    switch ((insn >> 7) & 3) {
    case 3:
        opsize = OS_WORD;
        break;
    case 2:
        if (m68k_feature(env, M68K_FEATURE_CHK2)) {
            opsize = OS_LONG;
            break;
        }
        /* fallthru */
    default:
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
        return;
    }
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);

    gen_flush_flags(s);
    gen_helper_chk(tcg_ctx, tcg_ctx->cpu_env, reg, src);
}